

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O1

BaseNode * __thiscall asmjit::BaseBuilder::addBefore(BaseBuilder *this,BaseNode *node,BaseNode *ref)

{
  uint8_t *puVar1;
  byte bVar2;
  BaseNode *pBVar3;
  BaseNode *pBVar4;
  BaseNode **ppBVar5;
  BaseNode *pBVar6;
  
  if (node == (BaseNode *)0x0) {
    addBefore();
LAB_001130b9:
    addBefore();
LAB_001130be:
    addBefore();
LAB_001130c3:
    addBefore();
  }
  else {
    if ((node->field_0).field_0._prev != (BaseNode *)0x0) goto LAB_001130b9;
    if ((node->field_0).field_0._next != (BaseNode *)0x0) goto LAB_001130be;
    bVar2 = (node->field_1)._any._nodeFlags;
    if ((char)bVar2 < '\0') goto LAB_001130c3;
    if (ref != (BaseNode *)0x0) {
      if ((char)(ref->field_1)._any._nodeFlags < '\0') {
        pBVar3 = (ref->field_0).field_0._prev;
        (node->field_0).field_0._prev = pBVar3;
        (node->field_0).field_0._next = ref;
        (node->field_1)._any._nodeFlags = bVar2 | 0x80;
        if ((node->field_1)._any._nodeType == '\x02') {
          this->_dirtySectionLinks = true;
        }
        (ref->field_0).field_0._prev = node;
        ppBVar5 = &(pBVar3->field_0).field_0._next;
        if (pBVar3 == (BaseNode *)0x0) {
          ppBVar5 = &this->_firstNode;
        }
        *ppBVar5 = node;
        return node;
      }
      goto LAB_001130cd;
    }
  }
  addBefore();
LAB_001130cd:
  addBefore();
  if ((char)(node->field_1)._any._nodeFlags < '\0') {
    pBVar3 = (node->field_0).field_0._prev;
    pBVar4 = (node->field_0).field_0._next;
    ppBVar5 = &(pBVar3->field_0).field_0._next;
    if (this->_firstNode == node) {
      ppBVar5 = &this->_firstNode;
    }
    *ppBVar5 = pBVar4;
    pBVar6 = (BaseNode *)&this->_lastNode;
    if (this->_lastNode != node) {
      pBVar6 = pBVar4;
    }
    (pBVar6->field_0).field_0._prev = pBVar3;
    (node->field_0).field_0._prev = (BaseNode *)0x0;
    (node->field_0).field_0._next = (BaseNode *)0x0;
    puVar1 = &(node->field_1)._any._nodeFlags;
    *puVar1 = *puVar1 & 0x7f;
    if ((node->field_1)._any._nodeType == '\x02') {
      this->_dirtySectionLinks = true;
    }
    if (this->_cursor == node) {
      this->_cursor = pBVar3;
      return node;
    }
  }
  return node;
}

Assistant:

BaseNode* BaseBuilder::addBefore(BaseNode* node, BaseNode* ref) noexcept {
  ASMJIT_ASSERT(node != nullptr);
  ASMJIT_ASSERT(!node->_prev);
  ASMJIT_ASSERT(!node->_next);
  ASMJIT_ASSERT(!node->isActive());
  ASMJIT_ASSERT(ref != nullptr);
  ASMJIT_ASSERT(ref->isActive());

  BaseNode* prev = ref->prev();
  BaseNode* next = ref;

  node->_prev = prev;
  node->_next = next;

  node->addFlags(BaseNode::kFlagIsActive);
  if (node->isSection())
    _dirtySectionLinks = true;

  next->_prev = node;
  if (prev)
    prev->_next = node;
  else
    _firstNode = node;

  return node;
}